

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_processing_sse2.c
# Opt level: O0

void ApplyAlphaMultiply_SSE2(uint8_t *rgba,int alpha_first,int w,int h,int stride)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uint uVar13;
  int iVar14;
  undefined8 *puVar15;
  long lVar16;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  ushort uVar17;
  ushort uVar18;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  ushort uVar33;
  ushort uVar34;
  __m128i A0_lo_1;
  __m128i alpha2_hi_1;
  __m128i alpha2_lo_1;
  __m128i alpha1_hi_1;
  __m128i alpha1_lo_1;
  __m128i alpha0_hi_1;
  __m128i alpha0_lo_1;
  __m128i argb1_hi_1;
  __m128i argb1_lo_1;
  __m128i argb0_1;
  __m128i A3;
  __m128i A2_hi;
  __m128i A2_lo;
  __m128i A1_hi;
  __m128i A1_lo;
  __m128i A0_hi;
  __m128i A0_lo;
  __m128i alpha2_hi;
  __m128i alpha2_lo;
  __m128i alpha1_hi;
  __m128i alpha1_lo;
  __m128i alpha0_hi;
  __m128i alpha0_lo;
  __m128i argb1_hi;
  __m128i argb1_lo;
  __m128i argb0;
  int i;
  uint32_t *rgbx;
  int kSpan;
  __m128i kMask;
  __m128i kMult;
  __m128i zero;
  int local_3cc;
  int local_37c;
  long local_370;
  byte local_2f8;
  byte bStack_2f7;
  byte bStack_2f6;
  byte bStack_2f5;
  byte bStack_2f4;
  byte bStack_2f3;
  byte bStack_2f2;
  byte bStack_2f1;
  byte local_2d8;
  byte bStack_2d7;
  byte bStack_2d6;
  byte bStack_2d5;
  byte bStack_2d4;
  byte bStack_2d3;
  byte bStack_2d2;
  byte bStack_2d1;
  ushort uStack_246;
  ushort uStack_244;
  ushort uStack_242;
  ushort uStack_23e;
  ushort uStack_23c;
  ushort uStack_23a;
  short local_238;
  short sStack_236;
  short sStack_234;
  short sStack_232;
  short sStack_230;
  short sStack_22e;
  short sStack_22c;
  short sStack_22a;
  ushort uStack_226;
  ushort uStack_224;
  ushort uStack_222;
  ushort uStack_21e;
  ushort uStack_21c;
  ushort uStack_21a;
  short local_218;
  short sStack_216;
  short sStack_214;
  short sStack_212;
  short sStack_210;
  short sStack_20e;
  short sStack_20c;
  short sStack_20a;
  ushort uStack_206;
  ushort uStack_204;
  ushort uStack_202;
  ushort uStack_1fe;
  ushort uStack_1fc;
  ushort uStack_1fa;
  short local_1f8;
  short sStack_1f6;
  short sStack_1f4;
  short sStack_1f2;
  short sStack_1f0;
  short sStack_1ee;
  short sStack_1ec;
  short sStack_1ea;
  ushort uStack_1e6;
  ushort uStack_1e4;
  ushort uStack_1e2;
  ushort uStack_1de;
  ushort uStack_1dc;
  ushort uStack_1da;
  short local_1d8;
  short sStack_1d6;
  short sStack_1d4;
  short sStack_1d2;
  short sStack_1d0;
  short sStack_1ce;
  short sStack_1cc;
  short sStack_1ca;
  byte bStack_e0;
  byte bStack_df;
  byte bStack_de;
  byte bStack_dd;
  byte bStack_dc;
  byte bStack_db;
  byte bStack_da;
  byte bStack_d9;
  byte bStack_c0;
  byte bStack_bf;
  byte bStack_be;
  byte bStack_bd;
  byte bStack_bc;
  byte bStack_bb;
  byte bStack_ba;
  byte bStack_b9;
  ushort local_a8;
  ushort uStack_a6;
  ushort uStack_a4;
  ushort uStack_a2;
  ushort uStack_a0;
  ushort uStack_9e;
  ushort uStack_9c;
  ushort uStack_9a;
  ushort local_88;
  ushort uStack_86;
  ushort uStack_84;
  ushort uStack_82;
  ushort uStack_80;
  ushort uStack_7e;
  ushort uStack_7c;
  ushort uStack_7a;
  uint32_t mult;
  uint32_t a;
  uint8_t *alpha;
  uint8_t *rgb;
  __m128i A3_1;
  __m128i A2_hi_1;
  __m128i A2_lo_1;
  __m128i A1_hi_1;
  __m128i A1_lo_1;
  __m128i A0_hi_1;
  
  local_37c = in_ECX;
  local_370 = in_RDI;
  while (0 < local_37c) {
    if (in_ESI == 0) {
      for (local_3cc = 0; local_3cc + 4 <= in_EDX; local_3cc = local_3cc + 4) {
        puVar15 = (undefined8 *)(local_370 + (long)local_3cc * 4);
        uVar1 = *puVar15;
        uVar2 = puVar15[1];
        local_2d8 = (byte)uVar1;
        bStack_2d7 = (byte)((ulong)uVar1 >> 8);
        bStack_2d6 = (byte)((ulong)uVar1 >> 0x10);
        bStack_2d5 = (byte)((ulong)uVar1 >> 0x18);
        bStack_2d4 = (byte)((ulong)uVar1 >> 0x20);
        bStack_2d3 = (byte)((ulong)uVar1 >> 0x28);
        bStack_2d2 = (byte)((ulong)uVar1 >> 0x30);
        bStack_2d1 = (byte)((ulong)uVar1 >> 0x38);
        bStack_c0 = (byte)uVar2;
        bStack_bf = (byte)((ulong)uVar2 >> 8);
        bStack_be = (byte)((ulong)uVar2 >> 0x10);
        bStack_bd = (byte)((ulong)uVar2 >> 0x18);
        bStack_bc = (byte)((ulong)uVar2 >> 0x20);
        bStack_bb = (byte)((ulong)uVar2 >> 0x28);
        bStack_ba = (byte)((ulong)uVar2 >> 0x30);
        bStack_b9 = (byte)((ulong)uVar2 >> 0x38);
        auVar4._8_8_ = (ulong)CONCAT16(bStack_2d1,
                                       (uint6)CONCAT14(bStack_2d2,
                                                       (uint)CONCAT12(bStack_2d3,(ushort)bStack_2d4)
                                                      )) | 0xff00ff0000;
        auVar4._0_8_ = (ulong)CONCAT16(bStack_2d5,
                                       (uint6)CONCAT14(bStack_2d6,
                                                       (uint)CONCAT12(bStack_2d7,(ushort)local_2d8))
                                      ) | 0xff00ff0000;
        auVar19 = pshuflw(auVar4,auVar4,0xbf);
        auVar3._8_8_ = (ulong)CONCAT16(bStack_b9,
                                       (uint6)CONCAT14(bStack_ba,
                                                       (uint)CONCAT12(bStack_bb,(ushort)bStack_bc)))
                       | 0xff00ff0000;
        auVar3._0_8_ = (ulong)CONCAT16(bStack_bd,
                                       (uint6)CONCAT14(bStack_be,
                                                       (uint)CONCAT12(bStack_bf,(ushort)bStack_c0)))
                       | 0xff00ff0000;
        auVar20 = pshuflw(auVar3,auVar3,0xbf);
        auVar19 = pshufhw(auVar19,auVar19,0xbf);
        auVar20 = pshufhw(auVar20,auVar20,0xbf);
        local_1d8 = auVar19._0_2_;
        sStack_1d6 = auVar19._2_2_;
        sStack_1d4 = auVar19._4_2_;
        sStack_1d2 = auVar19._6_2_;
        sStack_1d0 = auVar19._8_2_;
        sStack_1ce = auVar19._10_2_;
        sStack_1cc = auVar19._12_2_;
        sStack_1ca = auVar19._14_2_;
        uStack_1e6 = (ushort)bStack_2d7;
        uStack_1e4 = (ushort)bStack_2d6;
        uStack_1e2 = (ushort)bStack_2d5;
        uStack_1de = (ushort)bStack_2d3;
        uStack_1dc = (ushort)bStack_2d2;
        uStack_1da = (ushort)bStack_2d1;
        local_1f8 = auVar20._0_2_;
        sStack_1f6 = auVar20._2_2_;
        sStack_1f4 = auVar20._4_2_;
        sStack_1f2 = auVar20._6_2_;
        sStack_1f0 = auVar20._8_2_;
        sStack_1ee = auVar20._10_2_;
        sStack_1ec = auVar20._12_2_;
        sStack_1ea = auVar20._14_2_;
        uStack_206 = (ushort)bStack_bf;
        uStack_204 = (ushort)bStack_be;
        uStack_202 = (ushort)bStack_bd;
        uStack_1fe = (ushort)bStack_bb;
        uStack_1fc = (ushort)bStack_ba;
        uStack_1fa = (ushort)bStack_b9;
        auVar12._2_2_ = sStack_1d6 * uStack_1e6;
        auVar12._0_2_ = local_1d8 * (ushort)local_2d8;
        auVar12._4_2_ = sStack_1d4 * uStack_1e4;
        auVar12._6_2_ = sStack_1d2 * uStack_1e2;
        auVar12._10_2_ = sStack_1ce * uStack_1de;
        auVar12._8_2_ = sStack_1d0 * (ushort)bStack_2d4;
        auVar12._12_2_ = sStack_1cc * uStack_1dc;
        auVar12._14_2_ = sStack_1ca * uStack_1da;
        auVar11._8_8_ = 0x8081808180818081;
        auVar11._0_8_ = 0x8081808180818081;
        auVar19 = pmulhuw(auVar12,auVar11);
        auVar10._2_2_ = sStack_1f6 * uStack_206;
        auVar10._0_2_ = local_1f8 * (ushort)bStack_c0;
        auVar10._4_2_ = sStack_1f4 * uStack_204;
        auVar10._6_2_ = sStack_1f2 * uStack_202;
        auVar10._10_2_ = sStack_1ee * uStack_1fe;
        auVar10._8_2_ = sStack_1f0 * (ushort)bStack_bc;
        auVar10._12_2_ = sStack_1ec * uStack_1fc;
        auVar10._14_2_ = sStack_1ea * uStack_1fa;
        auVar9._8_8_ = 0x8081808180818081;
        auVar9._0_8_ = 0x8081808180818081;
        auVar20 = pmulhuw(auVar10,auVar9);
        A2_hi_1[1]._0_2_ = auVar19._0_2_;
        A2_hi_1[1]._2_2_ = auVar19._2_2_;
        A2_hi_1[1]._4_2_ = auVar19._4_2_;
        A2_hi_1[1]._6_2_ = auVar19._6_2_;
        A2_lo_1[0]._0_2_ = auVar19._8_2_;
        A2_lo_1[0]._2_2_ = auVar19._10_2_;
        A2_lo_1[0]._4_2_ = auVar19._12_2_;
        A2_lo_1[0]._6_2_ = auVar19._14_2_;
        uVar17 = (ushort)A2_hi_1[1] >> 7;
        uVar21 = A2_hi_1[1]._2_2_ >> 7;
        uVar23 = A2_hi_1[1]._4_2_ >> 7;
        uVar25 = A2_hi_1[1]._6_2_ >> 7;
        uVar27 = (ushort)A2_lo_1[0] >> 7;
        uVar29 = A2_lo_1[0]._2_2_ >> 7;
        uVar31 = A2_lo_1[0]._4_2_ >> 7;
        uVar33 = A2_lo_1[0]._6_2_ >> 7;
        rgb._0_2_ = auVar20._0_2_;
        rgb._2_2_ = auVar20._2_2_;
        rgb._4_2_ = auVar20._4_2_;
        rgb._6_2_ = auVar20._6_2_;
        A3_1[0]._0_2_ = auVar20._8_2_;
        A3_1[0]._2_2_ = auVar20._10_2_;
        A3_1[0]._4_2_ = auVar20._12_2_;
        A3_1[0]._6_2_ = auVar20._14_2_;
        uVar18 = (ushort)rgb >> 7;
        uVar22 = rgb._2_2_ >> 7;
        uVar24 = rgb._4_2_ >> 7;
        uVar26 = rgb._6_2_ >> 7;
        uVar28 = (ushort)A3_1[0] >> 7;
        uVar30 = A3_1[0]._2_2_ >> 7;
        uVar32 = A3_1[0]._4_2_ >> 7;
        uVar34 = A3_1[0]._6_2_ >> 7;
        puVar15 = (undefined8 *)(local_370 + (long)local_3cc * 4);
        *puVar15 = CONCAT17((uVar33 != 0) * (uVar33 < 0x100) * (char)uVar33 - (0xff < uVar33),
                            CONCAT16((uVar31 != 0) * (uVar31 < 0x100) * (char)uVar31 -
                                     (0xff < uVar31),
                                     CONCAT15((uVar29 != 0) * (uVar29 < 0x100) * (char)uVar29 -
                                              (0xff < uVar29),
                                              CONCAT14((uVar27 != 0) * (uVar27 < 0x100) *
                                                       (char)uVar27 - (0xff < uVar27),
                                                       CONCAT13((uVar25 != 0) * (uVar25 < 0x100) *
                                                                (char)uVar25 - (0xff < uVar25),
                                                                CONCAT12((uVar23 != 0) *
                                                                         (uVar23 < 0x100) *
                                                                         (char)uVar23 -
                                                                         (0xff < uVar23),
                                                                         CONCAT11((uVar21 != 0) *
                                                                                  (uVar21 < 0x100) *
                                                                                  (char)uVar21 -
                                                                                  (0xff < uVar21),
                                                                                  (uVar17 != 0) *
                                                                                  (uVar17 < 0x100) *
                                                                                  (char)uVar17 -
                                                                                  (0xff < uVar17))))
                                                      ))));
        puVar15[1] = CONCAT17((uVar34 != 0) * (uVar34 < 0x100) * (char)uVar34 - (0xff < uVar34),
                              CONCAT16((uVar32 != 0) * (uVar32 < 0x100) * (char)uVar32 -
                                       (0xff < uVar32),
                                       CONCAT15((uVar30 != 0) * (uVar30 < 0x100) * (char)uVar30 -
                                                (0xff < uVar30),
                                                CONCAT14((uVar28 != 0) * (uVar28 < 0x100) *
                                                         (char)uVar28 - (0xff < uVar28),
                                                         CONCAT13((uVar26 != 0) * (uVar26 < 0x100) *
                                                                  (char)uVar26 - (0xff < uVar26),
                                                                  CONCAT12((uVar24 != 0) *
                                                                           (uVar24 < 0x100) *
                                                                           (char)uVar24 -
                                                                           (0xff < uVar24),
                                                                           CONCAT11((uVar22 != 0) *
                                                                                    (uVar22 < 0x100)
                                                                                    * (char)uVar22 -
                                                                                    (0xff < uVar22),
                                                                                    (uVar18 != 0) *
                                                                                    (uVar18 < 0x100)
                                                                                    * (char)uVar18 -
                                                                                    (0xff < uVar18))
                                                                          ))))));
      }
    }
    else {
      for (local_3cc = 0; local_3cc + 4 <= in_EDX; local_3cc = local_3cc + 4) {
        puVar15 = (undefined8 *)(local_370 + (long)local_3cc * 4);
        uVar1 = *puVar15;
        uVar2 = puVar15[1];
        local_2f8 = (byte)uVar1;
        bStack_2f7 = (byte)((ulong)uVar1 >> 8);
        bStack_2f6 = (byte)((ulong)uVar1 >> 0x10);
        bStack_2f5 = (byte)((ulong)uVar1 >> 0x18);
        bStack_2f4 = (byte)((ulong)uVar1 >> 0x20);
        bStack_2f3 = (byte)((ulong)uVar1 >> 0x28);
        bStack_2f2 = (byte)((ulong)uVar1 >> 0x30);
        bStack_2f1 = (byte)((ulong)uVar1 >> 0x38);
        bStack_e0 = (byte)uVar2;
        bStack_df = (byte)((ulong)uVar2 >> 8);
        bStack_de = (byte)((ulong)uVar2 >> 0x10);
        bStack_dd = (byte)((ulong)uVar2 >> 0x18);
        bStack_dc = (byte)((ulong)uVar2 >> 0x20);
        bStack_db = (byte)((ulong)uVar2 >> 0x28);
        bStack_da = (byte)((ulong)uVar2 >> 0x30);
        bStack_d9 = (byte)((ulong)uVar2 >> 0x38);
        auVar20._8_8_ =
             (ulong)CONCAT16(bStack_2f1,
                             (uint6)CONCAT14(bStack_2f2,
                                             (uint)CONCAT12(bStack_2f3,(ushort)bStack_2f4))) |
             0xff00ff0000;
        auVar20._0_8_ =
             (ulong)CONCAT16(bStack_2f5,
                             (uint6)CONCAT14(bStack_2f6,(uint)CONCAT12(bStack_2f7,(ushort)local_2f8)
                                            )) | 0xff00ff0000;
        auVar20 = pshuflw(auVar20,auVar20,1);
        auVar19._8_8_ =
             (ulong)CONCAT16(bStack_d9,
                             (uint6)CONCAT14(bStack_da,(uint)CONCAT12(bStack_db,(ushort)bStack_dc)))
             | 0xff00ff0000;
        auVar19._0_8_ =
             (ulong)CONCAT16(bStack_dd,
                             (uint6)CONCAT14(bStack_de,(uint)CONCAT12(bStack_df,(ushort)bStack_e0)))
             | 0xff00ff0000;
        auVar19 = pshuflw(auVar19,auVar19,1);
        auVar20 = pshufhw(auVar20,auVar20,1);
        auVar19 = pshufhw(auVar19,auVar19,1);
        local_218 = auVar20._0_2_;
        sStack_216 = auVar20._2_2_;
        sStack_214 = auVar20._4_2_;
        sStack_212 = auVar20._6_2_;
        sStack_210 = auVar20._8_2_;
        sStack_20e = auVar20._10_2_;
        sStack_20c = auVar20._12_2_;
        sStack_20a = auVar20._14_2_;
        uStack_226 = (ushort)bStack_2f7;
        uStack_224 = (ushort)bStack_2f6;
        uStack_222 = (ushort)bStack_2f5;
        uStack_21e = (ushort)bStack_2f3;
        uStack_21c = (ushort)bStack_2f2;
        uStack_21a = (ushort)bStack_2f1;
        local_238 = auVar19._0_2_;
        sStack_236 = auVar19._2_2_;
        sStack_234 = auVar19._4_2_;
        sStack_232 = auVar19._6_2_;
        sStack_230 = auVar19._8_2_;
        sStack_22e = auVar19._10_2_;
        sStack_22c = auVar19._12_2_;
        sStack_22a = auVar19._14_2_;
        uStack_246 = (ushort)bStack_df;
        uStack_244 = (ushort)bStack_de;
        uStack_242 = (ushort)bStack_dd;
        uStack_23e = (ushort)bStack_db;
        uStack_23c = (ushort)bStack_da;
        uStack_23a = (ushort)bStack_d9;
        auVar8._2_2_ = sStack_216 * uStack_226;
        auVar8._0_2_ = local_218 * (ushort)local_2f8;
        auVar8._4_2_ = sStack_214 * uStack_224;
        auVar8._6_2_ = sStack_212 * uStack_222;
        auVar8._10_2_ = sStack_20e * uStack_21e;
        auVar8._8_2_ = sStack_210 * (ushort)bStack_2f4;
        auVar8._12_2_ = sStack_20c * uStack_21c;
        auVar8._14_2_ = sStack_20a * uStack_21a;
        auVar7._8_8_ = 0x8081808180818081;
        auVar7._0_8_ = 0x8081808180818081;
        auVar19 = pmulhuw(auVar8,auVar7);
        auVar6._2_2_ = sStack_236 * uStack_246;
        auVar6._0_2_ = local_238 * (ushort)bStack_e0;
        auVar6._4_2_ = sStack_234 * uStack_244;
        auVar6._6_2_ = sStack_232 * uStack_242;
        auVar6._10_2_ = sStack_22e * uStack_23e;
        auVar6._8_2_ = sStack_230 * (ushort)bStack_dc;
        auVar6._12_2_ = sStack_22c * uStack_23c;
        auVar6._14_2_ = sStack_22a * uStack_23a;
        auVar5._8_8_ = 0x8081808180818081;
        auVar5._0_8_ = 0x8081808180818081;
        auVar20 = pmulhuw(auVar6,auVar5);
        local_88 = auVar19._0_2_;
        uStack_86 = auVar19._2_2_;
        uStack_84 = auVar19._4_2_;
        uStack_82 = auVar19._6_2_;
        uStack_80 = auVar19._8_2_;
        uStack_7e = auVar19._10_2_;
        uStack_7c = auVar19._12_2_;
        uStack_7a = auVar19._14_2_;
        local_88 = local_88 >> 7;
        uStack_86 = uStack_86 >> 7;
        uStack_84 = uStack_84 >> 7;
        uStack_82 = uStack_82 >> 7;
        uStack_80 = uStack_80 >> 7;
        uStack_7e = uStack_7e >> 7;
        uStack_7c = uStack_7c >> 7;
        uStack_7a = uStack_7a >> 7;
        local_a8 = auVar20._0_2_;
        uStack_a6 = auVar20._2_2_;
        uStack_a4 = auVar20._4_2_;
        uStack_a2 = auVar20._6_2_;
        uStack_a0 = auVar20._8_2_;
        uStack_9e = auVar20._10_2_;
        uStack_9c = auVar20._12_2_;
        uStack_9a = auVar20._14_2_;
        local_a8 = local_a8 >> 7;
        uStack_a6 = uStack_a6 >> 7;
        uStack_a4 = uStack_a4 >> 7;
        uStack_a2 = uStack_a2 >> 7;
        uStack_a0 = uStack_a0 >> 7;
        uStack_9e = uStack_9e >> 7;
        uStack_9c = uStack_9c >> 7;
        uStack_9a = uStack_9a >> 7;
        puVar15 = (undefined8 *)(local_370 + (long)local_3cc * 4);
        *puVar15 = CONCAT17((uStack_7a != 0) * (uStack_7a < 0x100) * (char)uStack_7a -
                            (0xff < uStack_7a),
                            CONCAT16((uStack_7c != 0) * (uStack_7c < 0x100) * (char)uStack_7c -
                                     (0xff < uStack_7c),
                                     CONCAT15((uStack_7e != 0) * (uStack_7e < 0x100) *
                                              (char)uStack_7e - (0xff < uStack_7e),
                                              CONCAT14((uStack_80 != 0) * (uStack_80 < 0x100) *
                                                       (char)uStack_80 - (0xff < uStack_80),
                                                       CONCAT13((uStack_82 != 0) *
                                                                (uStack_82 < 0x100) *
                                                                (char)uStack_82 - (0xff < uStack_82)
                                                                ,CONCAT12((uStack_84 != 0) *
                                                                          (uStack_84 < 0x100) *
                                                                          (char)uStack_84 -
                                                                          (0xff < uStack_84),
                                                                          CONCAT11((uStack_86 != 0)
                                                                                   * (uStack_86 <
                                                                                     0x100) *
                                                                                   (char)uStack_86 -
                                                                                   (0xff < uStack_86
                                                                                   ),(local_88 != 0)
                                                                                     * (local_88 <
                                                                                       0x100) *
                                                                                     (char)local_88
                                                                                     - (0xff < 
                                                  local_88))))))));
        puVar15[1] = CONCAT17((uStack_9a != 0) * (uStack_9a < 0x100) * (char)uStack_9a -
                              (0xff < uStack_9a),
                              CONCAT16((uStack_9c != 0) * (uStack_9c < 0x100) * (char)uStack_9c -
                                       (0xff < uStack_9c),
                                       CONCAT15((uStack_9e != 0) * (uStack_9e < 0x100) *
                                                (char)uStack_9e - (0xff < uStack_9e),
                                                CONCAT14((uStack_a0 != 0) * (uStack_a0 < 0x100) *
                                                         (char)uStack_a0 - (0xff < uStack_a0),
                                                         CONCAT13((uStack_a2 != 0) *
                                                                  (uStack_a2 < 0x100) *
                                                                  (char)uStack_a2 -
                                                                  (0xff < uStack_a2),
                                                                  CONCAT12((uStack_a4 != 0) *
                                                                           (uStack_a4 < 0x100) *
                                                                           (char)uStack_a4 -
                                                                           (0xff < uStack_a4),
                                                                           CONCAT11((uStack_a6 != 0)
                                                                                    * (uStack_a6 <
                                                                                      0x100) *
                                                                                    (char)uStack_a6
                                                                                    - (0xff < 
                                                  uStack_a6),
                                                  (local_a8 != 0) * (local_a8 < 0x100) *
                                                  (char)local_a8 - (0xff < local_a8))))))));
      }
    }
    for (; local_3cc < in_EDX; local_3cc = local_3cc + 1) {
      lVar16 = local_370 + (int)(uint)(in_ESI != 0);
      iVar14 = 3;
      if (in_ESI != 0) {
        iVar14 = 0;
      }
      uVar13 = (uint)*(byte *)(local_370 + iVar14 + (long)(local_3cc << 2));
      if (uVar13 != 0xff) {
        iVar14 = uVar13 * 0x8081;
        *(char *)(lVar16 + (local_3cc << 2)) =
             (char)((uint)*(byte *)(lVar16 + (local_3cc << 2)) * iVar14 >> 0x17);
        *(char *)(lVar16 + (local_3cc * 4 + 1)) =
             (char)((uint)*(byte *)(lVar16 + (local_3cc * 4 + 1)) * iVar14 >> 0x17);
        *(char *)(lVar16 + (local_3cc * 4 + 2)) =
             (char)((uint)*(byte *)(lVar16 + (local_3cc * 4 + 2)) * iVar14 >> 0x17);
      }
    }
    local_370 = local_370 + in_R8D;
    local_37c = local_37c + -1;
  }
  return;
}

Assistant:

void ApplyAlphaMultiply_SSE2(uint8_t* rgba, int alpha_first,
                                    int w, int h, int stride) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i kMult = _mm_set1_epi16(0x8081u);
  const __m128i kMask = _mm_set_epi16(0, 0xff, 0xff, 0, 0, 0xff, 0xff, 0);
  const int kSpan = 4;
  while (h-- > 0) {
    uint32_t* const rgbx = (uint32_t*)rgba;
    int i;
    if (!alpha_first) {
      for (i = 0; i + kSpan <= w; i += kSpan) {
        APPLY_ALPHA(rgbx[i], _MM_SHUFFLE(2, 3, 3, 3));
      }
    } else {
      for (i = 0; i + kSpan <= w; i += kSpan) {
        APPLY_ALPHA(rgbx[i], _MM_SHUFFLE(0, 0, 0, 1));
      }
    }
    // Finish with left-overs.
    for (; i < w; ++i) {
      uint8_t* const rgb = rgba + (alpha_first ? 1 : 0);
      const uint8_t* const alpha = rgba + (alpha_first ? 0 : 3);
      const uint32_t a = alpha[4 * i];
      if (a != 0xff) {
        const uint32_t mult = MULTIPLIER(a);
        rgb[4 * i + 0] = PREMULTIPLY(rgb[4 * i + 0], mult);
        rgb[4 * i + 1] = PREMULTIPLY(rgb[4 * i + 1], mult);
        rgb[4 * i + 2] = PREMULTIPLY(rgb[4 * i + 2], mult);
      }
    }
    rgba += stride;
  }
}